

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  size_t k;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  vbool<4> vVar7;
  char cVar8;
  undefined4 in_EAX;
  uint uVar9;
  size_t mask;
  ulong uVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  RayQueryContext *pRVar14;
  RayQueryContext *pRVar15;
  RayQueryContext *extraout_RDX;
  ulong uVar16;
  NodeRef *pNVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  RayQueryContext *pRVar19;
  bool bVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  float fVar42;
  float fVar43;
  vint4 bi;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar51;
  float fVar52;
  vint4 ai_3;
  undefined1 auVar45 [16];
  float fVar53;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar49;
  undefined1 auVar50 [16];
  float fVar54;
  float fVar57;
  float fVar58;
  vint4 ai_1;
  float fVar59;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar55;
  undefined1 auVar56 [16];
  float fVar60;
  float fVar63;
  float fVar64;
  vint4 ai;
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  uint uVar69;
  uint uVar70;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  vint4 ai_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar80;
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  vfloat4 a0;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  vint4 bi_3;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  float fVar98;
  uint uVar99;
  float fVar103;
  uint uVar104;
  float fVar105;
  uint uVar106;
  vint4 bi_1;
  undefined1 auVar100 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar101;
  undefined1 auVar102 [16];
  float fVar107;
  uint uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar114;
  TravRayK<4,_true> *tray_00;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar50 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar74 = *(undefined1 (*) [16])(ray + 0x80);
    auVar61._0_12_ = ZEXT812(0);
    auVar61._12_4_ = 0;
    auVar45._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar74._0_4_);
    auVar45._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar74._4_4_);
    auVar45._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar74._8_4_);
    auVar45._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar74._12_4_);
    uVar9 = movmskps(in_EAX,auVar45);
    if (uVar9 != 0) {
      uVar10 = (ulong)(uVar9 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar60 = tray.dir.field_0._0_4_;
      fVar63 = tray.dir.field_0._4_4_;
      fVar64 = tray.dir.field_0._8_4_;
      fVar65 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar54 = tray.dir.field_0._16_4_;
      fVar57 = tray.dir.field_0._20_4_;
      fVar58 = tray.dir.field_0._24_4_;
      fVar59 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar44 = tray.dir.field_0._32_4_;
      fVar51 = tray.dir.field_0._36_4_;
      fVar52 = tray.dir.field_0._40_4_;
      fVar53 = tray.dir.field_0._44_4_;
      auVar82._0_4_ = fVar54 * fVar54 + fVar44 * fVar44;
      auVar82._4_4_ = fVar57 * fVar57 + fVar51 * fVar51;
      auVar82._8_4_ = fVar58 * fVar58 + fVar52 * fVar52;
      auVar82._12_4_ = fVar59 * fVar59 + fVar53 * fVar53;
      auVar86._0_4_ = fVar60 * fVar60 + auVar82._0_4_;
      auVar86._4_4_ = fVar63 * fVar63 + auVar82._4_4_;
      auVar86._8_4_ = fVar64 * fVar64 + auVar82._8_4_;
      auVar86._12_4_ = fVar65 * fVar65 + auVar82._12_4_;
      auVar82 = rsqrtps(auVar82,auVar86);
      fVar114 = auVar82._0_4_;
      fVar22 = auVar82._4_4_;
      fVar23 = auVar82._8_4_;
      fVar42 = auVar82._12_4_;
      pre.depth_scale.field_0.v[0] =
           fVar114 * fVar114 * auVar86._0_4_ * -0.5 * fVar114 + fVar114 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar22 * fVar22 * auVar86._4_4_ * -0.5 * fVar22 + fVar22 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar23 * fVar23 * auVar86._8_4_ * -0.5 * fVar23 + fVar23 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar42 * fVar42 * auVar86._12_4_ * -0.5 * fVar42 + fVar42 * 1.5
      ;
      do {
        lVar4 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar86 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar86 = insertps(auVar86,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar114 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar87._0_4_ = auVar86._0_4_ * fVar114;
        auVar87._4_4_ = auVar86._4_4_ * fVar114;
        auVar87._8_4_ = auVar86._8_4_ * fVar114;
        auVar87._12_4_ = auVar86._12_4_ * fVar114;
        auVar24._0_4_ = (uint)auVar87._4_4_ ^ (uint)DAT_01fec6d0;
        auVar24._4_4_ = (uint)auVar87._4_4_ ^ DAT_01fec6d0._4_4_;
        auVar24._8_4_ = (uint)auVar87._12_4_ ^ DAT_01fec6d0._8_4_;
        auVar24._12_4_ = (uint)auVar87._12_4_ ^ DAT_01fec6d0._12_4_;
        auVar86 = blendps(auVar24,auVar61,0xe);
        auVar110._4_4_ = auVar86._0_4_;
        auVar110._0_4_ = auVar87._8_4_;
        auVar110._8_4_ = auVar86._4_4_;
        auVar110._12_4_ = 0;
        auVar109._4_4_ = auVar86._0_4_;
        auVar109._0_4_ = auVar87._8_4_;
        auVar109._8_4_ = auVar86._4_4_;
        auVar109._12_4_ = 0;
        auVar109 = dpps(auVar109 << 0x20,auVar110 << 0x20,0x7f);
        auVar90._0_4_ = (uint)auVar87._8_4_ ^ (uint)DAT_01fec6d0;
        auVar90._4_4_ = (uint)auVar87._12_4_ ^ DAT_01fec6d0._4_4_;
        auVar90._8_4_ = (uint)auVar87._8_4_ ^ DAT_01fec6d0._8_4_;
        auVar90._12_4_ = (uint)auVar87._12_4_ ^ DAT_01fec6d0._12_4_;
        auVar82 = insertps(auVar90,auVar87,0x2a);
        auVar86 = dpps(auVar82,auVar82,0x7f);
        iVar21 = -(uint)(auVar86._0_4_ < auVar109._0_4_);
        auVar25._4_4_ = iVar21;
        auVar25._0_4_ = iVar21;
        auVar25._8_4_ = iVar21;
        auVar25._12_4_ = iVar21;
        auVar86 = blendvps(auVar82,auVar110 << 0x20,auVar25);
        auVar82 = dpps(auVar86,auVar86,0x7f);
        auVar110 = rsqrtss(auVar82,auVar82);
        fVar22 = auVar110._0_4_;
        fVar22 = fVar22 * 1.5 - fVar22 * fVar22 * auVar82._0_4_ * 0.5 * fVar22;
        fVar23 = fVar22 * auVar86._0_4_;
        fVar42 = fVar22 * auVar86._4_4_;
        fVar43 = fVar22 * auVar86._8_4_;
        fVar22 = fVar22 * auVar86._12_4_;
        fVar88 = fVar42 * auVar87._0_4_ - auVar87._4_4_ * fVar23;
        fVar93 = fVar43 * auVar87._4_4_ - auVar87._8_4_ * fVar42;
        fVar95 = fVar23 * auVar87._8_4_ - auVar87._0_4_ * fVar43;
        auVar91._12_4_ = fVar22 * auVar87._12_4_ - auVar87._12_4_ * fVar22;
        auVar91._0_8_ = CONCAT44(fVar95,fVar93);
        auVar91._8_4_ = fVar88;
        auVar100._8_4_ = fVar88;
        auVar100._0_8_ = auVar91._0_8_;
        auVar100._12_4_ = auVar91._12_4_;
        auVar86 = dpps(auVar100,auVar91,0x7f);
        pRVar14 = (RayQueryContext *)(lVar4 * 0x30);
        auVar82 = rsqrtss(auVar86,auVar86);
        fVar22 = auVar82._0_4_;
        fVar22 = fVar22 * 1.5 - fVar22 * fVar22 * auVar86._0_4_ * 0.5 * fVar22;
        aVar26.m128[1] = fVar22 * fVar88;
        aVar26.m128[0] = fVar43;
        aVar26.m128[2] = auVar87._8_4_ * fVar114;
        aVar26.m128[3] = 0.0;
        pre.ray_space[lVar4].vx.field_0.m128[0] = fVar23;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar22 * fVar93;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar87._0_4_ * fVar114;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar5.m128[1] = fVar22 * fVar95;
        aVar5.m128[0] = fVar42;
        aVar5.m128[2] = auVar87._4_4_ * fVar114;
        aVar5.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar5;
        pre.ray_space[lVar4].vz.field_0 = aVar26;
        uVar10 = uVar10 & uVar10 - 1;
      } while (uVar10 != 0);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar27._4_4_ = -(uint)(ABS(fVar63) < 1e-18);
      auVar27._0_4_ = -(uint)(ABS(fVar60) < 1e-18);
      auVar27._8_4_ = -(uint)(ABS(fVar64) < 1e-18);
      auVar27._12_4_ = -(uint)(ABS(fVar65) < 1e-18);
      auVar82 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar86 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar28._4_4_ = -(uint)(ABS(fVar57) < 1e-18);
      auVar28._0_4_ = -(uint)(ABS(fVar54) < 1e-18);
      auVar61 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar29._4_4_ = -(uint)(ABS(fVar51) < 1e-18);
      auVar29._0_4_ = -(uint)(ABS(fVar44) < 1e-18);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar82,_DAT_0201c930,auVar27);
      auVar28._8_4_ = -(uint)(ABS(fVar58) < 1e-18);
      auVar28._12_4_ = -(uint)(ABS(fVar59) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar86,_DAT_0201c930,auVar28);
      auVar29._8_4_ = -(uint)(ABS(fVar52) < 1e-18);
      auVar29._12_4_ = -(uint)(ABS(fVar53) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar61,_DAT_0201c930,auVar29);
      auVar46._0_12_ = ZEXT812(0);
      auVar46._12_4_ = 0;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar30._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar30._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar30._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar30._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar30);
      auVar31._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar31._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar31._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar31._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar31);
      auVar61 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar46);
      auVar74 = maxps(auVar74,auVar46);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar61,auVar45);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar74,auVar45);
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar74 ^ auVar45);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pRVar19 = (RayQueryContext *)0x3;
      }
      else {
        pRVar19 = (RayQueryContext *)
                  ((ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2);
      }
      pNVar17 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar18 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar21 = 0x224ff80;
      auVar74 = pmovsxbd(_DAT_01fec6d0,0x1010101);
      aVar101 = _DAT_01feb9f0;
      do {
        paVar18 = paVar18 + -1;
        root.ptr = pNVar17[-1].ptr;
        pNVar17 = pNVar17 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00251847:
          iVar21 = 3;
        }
        else {
          aVar49.v = *(__m128 *)paVar18->v;
          auVar32._4_4_ = -(uint)(aVar49.v[1] < tray.tfar.field_0.v[1]);
          auVar32._0_4_ = -(uint)(aVar49.v[0] < tray.tfar.field_0.v[0]);
          auVar32._8_4_ = -(uint)(aVar49.v[2] < tray.tfar.field_0.v[2]);
          auVar32._12_4_ = -(uint)(aVar49.v[3] < tray.tfar.field_0.v[3]);
          uVar9 = movmskps(iVar21,auVar32);
          if (uVar9 == 0) {
            iVar21 = 2;
          }
          else {
            uVar10 = (ulong)(uVar9 & 0xff);
            pRVar15 = (RayQueryContext *)(ulong)(uint)POPCOUNT(uVar9 & 0xff);
            iVar21 = 0;
            if (pRVar15 <= pRVar19) {
              do {
                k = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> k & 1) == 0; k = k + 1) {
                  }
                }
                tray_00 = &tray;
                pRVar14 = context;
                bVar20 = occluded1(This,bvh,root,k,&pre,ray,tray_00,context);
                if (bVar20) {
                  terminated.field_0.i[k] = -1;
                }
                uVar10 = uVar10 & uVar10 - 1;
              } while (uVar10 != 0);
              iVar12 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar21 = 3;
              auVar74 = pmovsxbd(auVar74,0x1010101);
              aVar101 = _DAT_01feb9f0;
              if (iVar12 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar21 = 2;
              }
            }
            vVar7.field_0 = terminated.field_0;
            if (pRVar19 < pRVar15) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar41._4_4_ = -(uint)(aVar49.v[1] < tray.tfar.field_0.v[1]);
                    auVar41._0_4_ = -(uint)(aVar49.v[0] < tray.tfar.field_0.v[0]);
                    auVar41._8_4_ = -(uint)(aVar49.v[2] < tray.tfar.field_0.v[2]);
                    auVar41._12_4_ = -(uint)(aVar49.v[3] < tray.tfar.field_0.v[3]);
                    iVar21 = movmskps(iVar21,auVar41);
                    if (iVar21 == 0) {
                      iVar21 = 2;
                    }
                    else {
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      uVar10 = (ulong)bVar1;
                      pvVar3 = This->leafIntersector;
                      local_17b8 = auVar50._0_8_;
                      uStack_17b0 = auVar50._8_8_;
                      valid_o.field_0._0_8_ = local_17b8;
                      valid_o.field_0._8_8_ = uStack_17b0;
                      uVar9 = movmskps((int)pRVar14,(undefined1  [16])terminated.field_0);
                      uVar9 = uVar9 ^ 0xf;
                      pRVar14 = (RayQueryContext *)(ulong)uVar9;
                      if (uVar9 != 0) {
                        uVar13 = (ulong)(byte)uVar9;
                        do {
                          lVar4 = 0;
                          if (uVar13 != 0) {
                            for (; (uVar13 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                            }
                          }
                          cVar8 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                            (&pre,ray,lVar4,context,
                                             (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar8 != '\0') {
                            valid_o.field_0.i[lVar4] = -1;
                          }
                          uVar10 = uVar13 - 1;
                          uVar13 = uVar13 & uVar10;
                          pRVar14 = extraout_RDX;
                        } while (uVar13 != 0);
                      }
                      auVar6._8_8_ = valid_o.field_0._8_8_;
                      auVar6._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           ((undefined1  [16])vVar7.field_0 | auVar6);
                      iVar21 = movmskps((int)uVar10,(undefined1  [16])terminated.field_0);
                      if (iVar21 == 0xf) {
                        iVar21 = 3;
                      }
                      else {
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                      (undefined1  [16])terminated.field_0);
                        iVar21 = 0;
                      }
                    }
                    auVar74 = pmovsxbd(auVar74,0x1010101);
                    aVar101 = _DAT_01feb9f0;
                    break;
                  }
                  goto LAB_00251847;
                }
                uVar13 = root.ptr & 0xfffffffffffffff0;
                pRVar15 = (RayQueryContext *)0x0;
                uVar10 = 8;
                aVar55 = aVar101;
                do {
                  uVar2 = *(ulong *)(uVar13 + (long)pRVar15 * 8);
                  uVar16 = uVar10;
                  aVar49 = aVar55;
                  if (uVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      fVar44 = *(float *)(root.ptr + 0x20 + (long)pRVar15 * 4);
                      fVar51 = *(float *)(root.ptr + 0x30 + (long)pRVar15 * 4);
                      fVar52 = *(float *)(root.ptr + 0x40 + (long)pRVar15 * 4);
                      fVar53 = *(float *)(root.ptr + 0x50 + (long)pRVar15 * 4);
                      auVar47._0_8_ =
                           CONCAT44((fVar44 - (float)tray.org.field_0._4_4_) *
                                    (float)tray.rdir.field_0._4_4_,
                                    (fVar44 - (float)tray.org.field_0._0_4_) *
                                    (float)tray.rdir.field_0._0_4_);
                      auVar47._8_4_ =
                           (fVar44 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_
                      ;
                      auVar47._12_4_ =
                           (fVar44 - (float)tray.org.field_0._12_4_) *
                           (float)tray.rdir.field_0._12_4_;
                      auVar33._0_8_ =
                           CONCAT44((fVar52 - (float)tray.org.field_0._20_4_) *
                                    (float)tray.rdir.field_0._20_4_,
                                    (fVar52 - (float)tray.org.field_0._16_4_) *
                                    (float)tray.rdir.field_0._16_4_);
                      auVar33._8_4_ =
                           (fVar52 - (float)tray.org.field_0._24_4_) *
                           (float)tray.rdir.field_0._24_4_;
                      auVar33._12_4_ =
                           (fVar52 - (float)tray.org.field_0._28_4_) *
                           (float)tray.rdir.field_0._28_4_;
                      fVar44 = *(float *)(root.ptr + 0x60 + (long)pRVar15 * 4);
                      auVar75._0_8_ =
                           CONCAT44((fVar44 - (float)tray.org.field_0._36_4_) *
                                    (float)tray.rdir.field_0._36_4_,
                                    (fVar44 - (float)tray.org.field_0._32_4_) *
                                    (float)tray.rdir.field_0._32_4_);
                      auVar75._8_4_ =
                           (fVar44 - (float)tray.org.field_0._40_4_) *
                           (float)tray.rdir.field_0._40_4_;
                      auVar75._12_4_ =
                           (fVar44 - (float)tray.org.field_0._44_4_) *
                           (float)tray.rdir.field_0._44_4_;
                      auVar56._0_4_ =
                           (fVar51 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_
                      ;
                      auVar56._4_4_ =
                           (fVar51 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_
                      ;
                      auVar56._8_4_ =
                           (fVar51 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_
                      ;
                      auVar56._12_4_ =
                           (fVar51 - (float)tray.org.field_0._12_4_) *
                           (float)tray.rdir.field_0._12_4_;
                      auVar62._0_4_ =
                           (fVar53 - (float)tray.org.field_0._16_4_) *
                           (float)tray.rdir.field_0._16_4_;
                      auVar62._4_4_ =
                           (fVar53 - (float)tray.org.field_0._20_4_) *
                           (float)tray.rdir.field_0._20_4_;
                      auVar62._8_4_ =
                           (fVar53 - (float)tray.org.field_0._24_4_) *
                           (float)tray.rdir.field_0._24_4_;
                      auVar62._12_4_ =
                           (fVar53 - (float)tray.org.field_0._28_4_) *
                           (float)tray.rdir.field_0._28_4_;
                      fVar44 = *(float *)(root.ptr + 0x70 + (long)pRVar15 * 4);
                      auVar83._0_4_ =
                           (fVar44 - (float)tray.org.field_0._32_4_) *
                           (float)tray.rdir.field_0._32_4_;
                      auVar83._4_4_ =
                           (fVar44 - (float)tray.org.field_0._36_4_) *
                           (float)tray.rdir.field_0._36_4_;
                      auVar83._8_4_ =
                           (fVar44 - (float)tray.org.field_0._40_4_) *
                           (float)tray.rdir.field_0._40_4_;
                      auVar83._12_4_ =
                           (fVar44 - (float)tray.org.field_0._44_4_) *
                           (float)tray.rdir.field_0._44_4_;
                      auVar67._8_4_ = auVar47._8_4_;
                      auVar67._0_8_ = auVar47._0_8_;
                      auVar67._12_4_ = auVar47._12_4_;
                      auVar61 = minps(auVar67,auVar56);
                      auVar84._8_4_ = auVar33._8_4_;
                      auVar84._0_8_ = auVar33._0_8_;
                      auVar84._12_4_ = auVar33._12_4_;
                      auVar86 = minps(auVar84,auVar62);
                      auVar61 = maxps(auVar61,auVar86);
                      auVar85._8_4_ = auVar75._8_4_;
                      auVar85._0_8_ = auVar75._0_8_;
                      auVar85._12_4_ = auVar75._12_4_;
                      auVar86 = minps(auVar85,auVar83);
                      auVar61 = maxps(auVar61,auVar86);
                      auVar68._0_8_ =
                           CONCAT44(auVar61._4_4_ * 0.99999964,auVar61._0_4_ * 0.99999964);
                      auVar68._8_4_ = auVar61._8_4_ * 0.99999964;
                      auVar68._12_4_ = auVar61._12_4_ * 0.99999964;
                      auVar86 = maxps(auVar47,auVar56);
                      auVar61 = maxps(auVar33,auVar62);
                      auVar61 = minps(auVar86,auVar61);
                      auVar86 = maxps(auVar75,auVar83);
                      auVar86 = minps(auVar61,auVar86);
                      auVar34._8_4_ = auVar68._8_4_;
                      auVar34._0_8_ = auVar68._0_8_;
                      auVar34._12_4_ = auVar68._12_4_;
                      auVar61 = maxps(auVar34,(undefined1  [16])tray.tnear.field_0);
                      auVar48._0_4_ = auVar86._0_4_ * 1.0000004;
                      auVar48._4_4_ = auVar86._4_4_ * 1.0000004;
                      auVar48._8_4_ = auVar86._8_4_ * 1.0000004;
                      auVar48._12_4_ = auVar86._12_4_ * 1.0000004;
                      auVar86 = minps(auVar48,(undefined1  [16])tray.tfar.field_0);
                      auVar35._4_4_ = -(uint)(auVar61._4_4_ <= auVar86._4_4_);
                      auVar35._0_4_ = -(uint)(auVar61._0_4_ <= auVar86._0_4_);
                      auVar35._8_4_ = -(uint)(auVar61._8_4_ <= auVar86._8_4_);
                      auVar35._12_4_ = -(uint)(auVar61._12_4_ <= auVar86._12_4_);
                    }
                    else {
                      fVar44 = *(float *)(uVar13 + 0x20 + (long)pRVar15 * 4);
                      fVar51 = *(float *)(uVar13 + 0x30 + (long)pRVar15 * 4);
                      fVar52 = *(float *)(uVar13 + 0x40 + (long)pRVar15 * 4);
                      fVar53 = *(float *)(uVar13 + 0x50 + (long)pRVar15 * 4);
                      fVar54 = *(float *)(uVar13 + 0x60 + (long)pRVar15 * 4);
                      fVar57 = *(float *)(uVar13 + 0x70 + (long)pRVar15 * 4);
                      fVar58 = *(float *)(uVar13 + 0x80 + (long)pRVar15 * 4);
                      fVar59 = *(float *)(uVar13 + 0x90 + (long)pRVar15 * 4);
                      fVar60 = *(float *)(uVar13 + 0xa0 + (long)pRVar15 * 4);
                      auVar92._0_4_ =
                           (float)tray.dir.field_0._16_4_ * fVar57 +
                           (float)tray.dir.field_0._32_4_ * fVar60;
                      auVar92._4_4_ =
                           (float)tray.dir.field_0._20_4_ * fVar57 +
                           (float)tray.dir.field_0._36_4_ * fVar60;
                      auVar92._8_4_ =
                           (float)tray.dir.field_0._24_4_ * fVar57 +
                           (float)tray.dir.field_0._40_4_ * fVar60;
                      auVar92._12_4_ =
                           (float)tray.dir.field_0._28_4_ * fVar57 +
                           (float)tray.dir.field_0._44_4_ * fVar60;
                      auVar102._0_4_ =
                           fVar44 * (float)tray.dir.field_0._0_4_ +
                           fVar53 * (float)tray.dir.field_0._16_4_ +
                           fVar58 * (float)tray.dir.field_0._32_4_;
                      auVar102._4_4_ =
                           fVar44 * (float)tray.dir.field_0._4_4_ +
                           fVar53 * (float)tray.dir.field_0._20_4_ +
                           fVar58 * (float)tray.dir.field_0._36_4_;
                      auVar102._8_4_ =
                           fVar44 * (float)tray.dir.field_0._8_4_ +
                           fVar53 * (float)tray.dir.field_0._24_4_ +
                           fVar58 * (float)tray.dir.field_0._40_4_;
                      auVar102._12_4_ =
                           fVar44 * (float)tray.dir.field_0._12_4_ +
                           fVar53 * (float)tray.dir.field_0._28_4_ +
                           fVar58 * (float)tray.dir.field_0._44_4_;
                      auVar112._0_4_ =
                           fVar51 * (float)tray.dir.field_0._0_4_ +
                           fVar54 * (float)tray.dir.field_0._16_4_ +
                           fVar59 * (float)tray.dir.field_0._32_4_;
                      auVar112._4_4_ =
                           fVar51 * (float)tray.dir.field_0._4_4_ +
                           fVar54 * (float)tray.dir.field_0._20_4_ +
                           fVar59 * (float)tray.dir.field_0._36_4_;
                      auVar112._8_4_ =
                           fVar51 * (float)tray.dir.field_0._8_4_ +
                           fVar54 * (float)tray.dir.field_0._24_4_ +
                           fVar59 * (float)tray.dir.field_0._40_4_;
                      auVar112._12_4_ =
                           fVar51 * (float)tray.dir.field_0._12_4_ +
                           fVar54 * (float)tray.dir.field_0._28_4_ +
                           fVar59 * (float)tray.dir.field_0._44_4_;
                      fVar63 = (float)DAT_01ff1d40;
                      fVar64 = DAT_01ff1d40._4_4_;
                      fVar65 = DAT_01ff1d40._8_4_;
                      fVar114 = DAT_01ff1d40._12_4_;
                      auVar37._4_4_ = -(uint)(ABS(auVar102._4_4_) < fVar64);
                      auVar37._0_4_ = -(uint)(ABS(auVar102._0_4_) < fVar63);
                      auVar37._8_4_ = -(uint)(ABS(auVar102._8_4_) < fVar65);
                      auVar37._12_4_ = -(uint)(ABS(auVar102._12_4_) < fVar114);
                      auVar61 = blendvps(auVar102,_DAT_01ff1d40,auVar37);
                      auVar38._4_4_ = -(uint)(ABS(auVar112._4_4_) < fVar64);
                      auVar38._0_4_ = -(uint)(ABS(auVar112._0_4_) < fVar63);
                      auVar38._8_4_ = -(uint)(ABS(auVar112._8_4_) < fVar65);
                      auVar38._12_4_ = -(uint)(ABS(auVar112._12_4_) < fVar114);
                      auVar82 = blendvps(auVar112,_DAT_01ff1d40,auVar38);
                      auVar111._0_4_ = (float)tray.dir.field_0._0_4_ * fVar52 + auVar92._0_4_;
                      auVar111._4_4_ = (float)tray.dir.field_0._4_4_ * fVar52 + auVar92._4_4_;
                      auVar111._8_4_ = (float)tray.dir.field_0._8_4_ * fVar52 + auVar92._8_4_;
                      auVar111._12_4_ = (float)tray.dir.field_0._12_4_ * fVar52 + auVar92._12_4_;
                      auVar39._4_4_ = -(uint)(ABS(auVar111._4_4_) < fVar64);
                      auVar39._0_4_ = -(uint)(ABS(auVar111._0_4_) < fVar63);
                      auVar39._8_4_ = -(uint)(ABS(auVar111._8_4_) < fVar65);
                      auVar39._12_4_ = -(uint)(ABS(auVar111._12_4_) < fVar114);
                      auVar86 = blendvps(auVar111,_DAT_01ff1d40,auVar39);
                      auVar74 = rcpps(auVar92,auVar61);
                      fVar114 = auVar74._0_4_;
                      fVar22 = auVar74._4_4_;
                      fVar23 = auVar74._8_4_;
                      fVar42 = auVar74._12_4_;
                      fVar65 = (float)DAT_01feca10;
                      fVar43 = DAT_01feca10._4_4_;
                      fVar88 = DAT_01feca10._12_4_;
                      fVar64 = DAT_01feca10._8_4_;
                      fVar114 = (fVar65 - auVar61._0_4_ * fVar114) * fVar114 + fVar114;
                      fVar22 = (fVar43 - auVar61._4_4_ * fVar22) * fVar22 + fVar22;
                      fVar23 = (fVar64 - auVar61._8_4_ * fVar23) * fVar23 + fVar23;
                      fVar42 = (fVar88 - auVar61._12_4_ * fVar42) * fVar42 + fVar42;
                      auVar74 = rcpps(auVar74,auVar82);
                      fVar98 = auVar74._0_4_;
                      auVar113._0_4_ = auVar82._0_4_ * fVar98;
                      fVar103 = auVar74._4_4_;
                      auVar113._4_4_ = auVar82._4_4_ * fVar103;
                      fVar105 = auVar74._8_4_;
                      auVar113._8_4_ = auVar82._8_4_ * fVar105;
                      fVar107 = auVar74._12_4_;
                      auVar113._12_4_ = auVar82._12_4_ * fVar107;
                      fVar98 = (fVar65 - auVar113._0_4_) * fVar98 + fVar98;
                      fVar103 = (fVar43 - auVar113._4_4_) * fVar103 + fVar103;
                      fVar105 = (fVar64 - auVar113._8_4_) * fVar105 + fVar105;
                      fVar107 = (fVar88 - auVar113._12_4_) * fVar107 + fVar107;
                      auVar74 = rcpps(auVar113,auVar86);
                      fVar89 = auVar74._0_4_;
                      fVar94 = auVar74._4_4_;
                      fVar96 = auVar74._8_4_;
                      fVar97 = auVar74._12_4_;
                      auVar74 = pmovsxbd(_DAT_01feca10,0x1010101);
                      fVar63 = *(float *)(uVar13 + 0xb0 + (long)pRVar15 * 4);
                      fVar89 = (fVar65 - auVar86._0_4_ * fVar89) * fVar89 + fVar89;
                      fVar94 = (fVar43 - auVar86._4_4_ * fVar94) * fVar94 + fVar94;
                      fVar96 = (fVar64 - auVar86._8_4_ * fVar96) * fVar96 + fVar96;
                      fVar97 = (fVar88 - auVar86._12_4_ * fVar97) * fVar97 + fVar97;
                      fVar64 = *(float *)(uVar13 + 0xc0 + (long)pRVar15 * 4);
                      fVar65 = *(float *)(uVar13 + 0xd0 + (long)pRVar15 * 4);
                      fVar88 = (fVar44 * (float)tray.org.field_0._0_4_ +
                               fVar53 * (float)tray.org.field_0._16_4_ +
                               fVar58 * (float)tray.org.field_0._32_4_ + fVar63) * -fVar114;
                      fVar93 = (fVar44 * (float)tray.org.field_0._4_4_ +
                               fVar53 * (float)tray.org.field_0._20_4_ +
                               fVar58 * (float)tray.org.field_0._36_4_ + fVar63) * -fVar22;
                      fVar95 = (fVar44 * (float)tray.org.field_0._8_4_ +
                               fVar53 * (float)tray.org.field_0._24_4_ +
                               fVar58 * (float)tray.org.field_0._40_4_ + fVar63) * -fVar23;
                      fVar66 = (fVar44 * (float)tray.org.field_0._12_4_ +
                               fVar53 * (float)tray.org.field_0._28_4_ +
                               fVar58 * (float)tray.org.field_0._44_4_ + fVar63) * -fVar42;
                      fVar58 = (fVar51 * (float)tray.org.field_0._0_4_ +
                               fVar54 * (float)tray.org.field_0._16_4_ +
                               fVar59 * (float)tray.org.field_0._32_4_ + fVar64) * -fVar98;
                      fVar63 = (fVar51 * (float)tray.org.field_0._4_4_ +
                               fVar54 * (float)tray.org.field_0._20_4_ +
                               fVar59 * (float)tray.org.field_0._36_4_ + fVar64) * -fVar103;
                      fVar43 = (fVar51 * (float)tray.org.field_0._8_4_ +
                               fVar54 * (float)tray.org.field_0._24_4_ +
                               fVar59 * (float)tray.org.field_0._40_4_ + fVar64) * -fVar105;
                      fVar54 = (fVar51 * (float)tray.org.field_0._12_4_ +
                               fVar54 * (float)tray.org.field_0._28_4_ +
                               fVar59 * (float)tray.org.field_0._44_4_ + fVar64) * -fVar107;
                      fVar44 = (fVar52 * (float)tray.org.field_0._0_4_ +
                               fVar57 * (float)tray.org.field_0._16_4_ +
                               fVar60 * (float)tray.org.field_0._32_4_ + fVar65) * -fVar89;
                      fVar51 = (fVar52 * (float)tray.org.field_0._4_4_ +
                               fVar57 * (float)tray.org.field_0._20_4_ +
                               fVar60 * (float)tray.org.field_0._36_4_ + fVar65) * -fVar94;
                      fVar53 = (fVar52 * (float)tray.org.field_0._8_4_ +
                               fVar57 * (float)tray.org.field_0._24_4_ +
                               fVar60 * (float)tray.org.field_0._40_4_ + fVar65) * -fVar96;
                      fVar52 = (fVar52 * (float)tray.org.field_0._12_4_ +
                               fVar57 * (float)tray.org.field_0._28_4_ +
                               fVar60 * (float)tray.org.field_0._44_4_ + fVar65) * -fVar97;
                      fVar114 = fVar114 + fVar88;
                      fVar22 = fVar22 + fVar93;
                      fVar23 = fVar23 + fVar95;
                      fVar42 = fVar42 + fVar66;
                      fVar98 = fVar98 + fVar58;
                      fVar103 = fVar103 + fVar63;
                      fVar105 = fVar105 + fVar43;
                      fVar107 = fVar107 + fVar54;
                      fVar89 = fVar89 + fVar44;
                      fVar94 = fVar94 + fVar51;
                      fVar96 = fVar96 + fVar53;
                      fVar97 = fVar97 + fVar52;
                      uVar9 = (uint)((int)fVar114 < (int)fVar88) * (int)fVar114 |
                              (uint)((int)fVar114 >= (int)fVar88) * (int)fVar88;
                      uVar69 = (uint)((int)fVar22 < (int)fVar93) * (int)fVar22 |
                               (uint)((int)fVar22 >= (int)fVar93) * (int)fVar93;
                      uVar70 = (uint)((int)fVar23 < (int)fVar95) * (int)fVar23 |
                               (uint)((int)fVar23 >= (int)fVar95) * (int)fVar95;
                      uVar71 = (uint)((int)fVar42 < (int)fVar66) * (int)fVar42 |
                               (uint)((int)fVar42 >= (int)fVar66) * (int)fVar66;
                      uVar72 = (uint)((int)fVar98 < (int)fVar58) * (int)fVar98 |
                               (uint)((int)fVar98 >= (int)fVar58) * (int)fVar58;
                      uVar76 = (uint)((int)fVar103 < (int)fVar63) * (int)fVar103 |
                               (uint)((int)fVar103 >= (int)fVar63) * (int)fVar63;
                      uVar78 = (uint)((int)fVar105 < (int)fVar43) * (int)fVar105 |
                               (uint)((int)fVar105 >= (int)fVar43) * (int)fVar43;
                      uVar80 = (uint)((int)fVar107 < (int)fVar54) * (int)fVar107 |
                               (uint)((int)fVar107 >= (int)fVar54) * (int)fVar54;
                      uVar73 = ((int)uVar72 < (int)uVar9) * uVar9 |
                               ((int)uVar72 >= (int)uVar9) * uVar72;
                      uVar77 = ((int)uVar76 < (int)uVar69) * uVar69 |
                               ((int)uVar76 >= (int)uVar69) * uVar76;
                      uVar79 = ((int)uVar78 < (int)uVar70) * uVar70 |
                               ((int)uVar78 >= (int)uVar70) * uVar78;
                      uVar81 = ((int)uVar80 < (int)uVar71) * uVar71 |
                               ((int)uVar80 >= (int)uVar71) * uVar80;
                      uVar72 = (uint)((int)fVar89 < (int)fVar44) * (int)fVar89 |
                               (uint)((int)fVar89 >= (int)fVar44) * (int)fVar44;
                      uVar76 = (uint)((int)fVar94 < (int)fVar51) * (int)fVar94 |
                               (uint)((int)fVar94 >= (int)fVar51) * (int)fVar51;
                      uVar78 = (uint)((int)fVar96 < (int)fVar53) * (int)fVar96 |
                               (uint)((int)fVar96 >= (int)fVar53) * (int)fVar53;
                      uVar80 = (uint)((int)fVar97 < (int)fVar52) * (int)fVar97 |
                               (uint)((int)fVar97 >= (int)fVar52) * (int)fVar52;
                      uVar9 = (uint)((int)fVar114 < (int)fVar88) * (int)fVar88 |
                              (uint)((int)fVar114 >= (int)fVar88) * (int)fVar114;
                      uVar69 = (uint)((int)fVar22 < (int)fVar93) * (int)fVar93 |
                               (uint)((int)fVar22 >= (int)fVar93) * (int)fVar22;
                      uVar70 = (uint)((int)fVar23 < (int)fVar95) * (int)fVar95 |
                               (uint)((int)fVar23 >= (int)fVar95) * (int)fVar23;
                      uVar71 = (uint)((int)fVar42 < (int)fVar66) * (int)fVar66 |
                               (uint)((int)fVar42 >= (int)fVar66) * (int)fVar42;
                      uVar99 = (uint)((int)fVar98 < (int)fVar58) * (int)fVar58 |
                               (uint)((int)fVar98 >= (int)fVar58) * (int)fVar98;
                      uVar104 = (uint)((int)fVar103 < (int)fVar63) * (int)fVar63 |
                                (uint)((int)fVar103 >= (int)fVar63) * (int)fVar103;
                      uVar106 = (uint)((int)fVar105 < (int)fVar43) * (int)fVar43 |
                                (uint)((int)fVar105 >= (int)fVar43) * (int)fVar105;
                      uVar108 = (uint)((int)fVar107 < (int)fVar54) * (int)fVar54 |
                                (uint)((int)fVar107 >= (int)fVar54) * (int)fVar107;
                      uVar99 = ((int)uVar9 < (int)uVar99) * uVar9 |
                               ((int)uVar9 >= (int)uVar99) * uVar99;
                      uVar104 = ((int)uVar69 < (int)uVar104) * uVar69 |
                                ((int)uVar69 >= (int)uVar104) * uVar104;
                      uVar106 = ((int)uVar70 < (int)uVar106) * uVar70 |
                                ((int)uVar70 >= (int)uVar106) * uVar106;
                      uVar108 = ((int)uVar71 < (int)uVar108) * uVar71 |
                                ((int)uVar71 >= (int)uVar108) * uVar108;
                      uVar9 = (uint)((int)fVar89 < (int)fVar44) * (int)fVar44 |
                              (uint)((int)fVar89 >= (int)fVar44) * (int)fVar89;
                      uVar69 = (uint)((int)fVar94 < (int)fVar51) * (int)fVar51 |
                               (uint)((int)fVar94 >= (int)fVar51) * (int)fVar94;
                      uVar70 = (uint)((int)fVar96 < (int)fVar53) * (int)fVar53 |
                               (uint)((int)fVar96 >= (int)fVar53) * (int)fVar96;
                      uVar71 = (uint)((int)fVar97 < (int)fVar52) * (int)fVar52 |
                               (uint)((int)fVar97 >= (int)fVar52) * (int)fVar97;
                      auVar68._0_4_ =
                           (float)(((int)uVar72 < (int)uVar73) * uVar73 |
                                  ((int)uVar72 >= (int)uVar73) * uVar72) * 0.99999964;
                      auVar68._4_4_ =
                           (float)(((int)uVar76 < (int)uVar77) * uVar77 |
                                  ((int)uVar76 >= (int)uVar77) * uVar76) * 0.99999964;
                      auVar68._8_4_ =
                           (float)(((int)uVar78 < (int)uVar79) * uVar79 |
                                  ((int)uVar78 >= (int)uVar79) * uVar78) * 0.99999964;
                      auVar68._12_4_ =
                           (float)(((int)uVar80 < (int)uVar81) * uVar81 |
                                  ((int)uVar80 >= (int)uVar81) * uVar80) * 0.99999964;
                      fVar44 = (float)(((int)uVar99 < (int)uVar9) * uVar99 |
                                      ((int)uVar99 >= (int)uVar9) * uVar9) * 1.0000004;
                      fVar51 = (float)(((int)uVar104 < (int)uVar69) * uVar104 |
                                      ((int)uVar104 >= (int)uVar69) * uVar69) * 1.0000004;
                      fVar52 = (float)(((int)uVar106 < (int)uVar70) * uVar106 |
                                      ((int)uVar106 >= (int)uVar70) * uVar70) * 1.0000004;
                      fVar53 = (float)(((int)uVar108 < (int)uVar71) * uVar108 |
                                      ((int)uVar108 >= (int)uVar71) * uVar71) * 1.0000004;
                      auVar35._4_4_ =
                           -(uint)((float)((uint)(tray.tnear.field_0.i[1] < (int)auVar68._4_4_) *
                                           (int)auVar68._4_4_ |
                                          (uint)(tray.tnear.field_0.i[1] >= (int)auVar68._4_4_) *
                                          tray.tnear.field_0.i[1]) <=
                                  (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar51) *
                                          tray.tfar.field_0.i[1] |
                                         (uint)(tray.tfar.field_0.i[1] >= (int)fVar51) * (int)fVar51
                                         ));
                      auVar35._0_4_ =
                           -(uint)((float)((uint)(tray.tnear.field_0.i[0] < (int)auVar68._0_4_) *
                                           (int)auVar68._0_4_ |
                                          (uint)(tray.tnear.field_0.i[0] >= (int)auVar68._0_4_) *
                                          tray.tnear.field_0.i[0]) <=
                                  (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar44) *
                                          tray.tfar.field_0.i[0] |
                                         (uint)(tray.tfar.field_0.i[0] >= (int)fVar44) * (int)fVar44
                                         ));
                      auVar35._8_4_ =
                           -(uint)((float)((uint)(tray.tnear.field_0.i[2] < (int)auVar68._8_4_) *
                                           (int)auVar68._8_4_ |
                                          (uint)(tray.tnear.field_0.i[2] >= (int)auVar68._8_4_) *
                                          tray.tnear.field_0.i[2]) <=
                                  (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar52) *
                                          tray.tfar.field_0.i[2] |
                                         (uint)(tray.tfar.field_0.i[2] >= (int)fVar52) * (int)fVar52
                                         ));
                      auVar35._12_4_ =
                           -(uint)((float)((uint)(tray.tnear.field_0.i[3] < (int)auVar68._12_4_) *
                                           (int)auVar68._12_4_ |
                                          (uint)(tray.tnear.field_0.i[3] >= (int)auVar68._12_4_) *
                                          tray.tnear.field_0.i[3]) <=
                                  (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar53) *
                                          tray.tfar.field_0.i[3] |
                                         (uint)(tray.tfar.field_0.i[3] >= (int)fVar53) * (int)fVar53
                                         ));
                      aVar101 = _DAT_01feb9f0;
                    }
                    if (((auVar74 & auVar35) != (undefined1  [16])0x0) &&
                       (auVar36._0_4_ = auVar35._0_4_ << 0x1f, auVar36._4_4_ = auVar35._4_4_ << 0x1f
                       , auVar36._8_4_ = auVar35._8_4_ << 0x1f,
                       auVar36._12_4_ = auVar35._12_4_ << 0x1f,
                       aVar49.v = (__m128)blendvps(aVar101.v,auVar68,auVar36), uVar16 = uVar2,
                       uVar10 != 8)) {
                      pNVar17->ptr = uVar10;
                      pNVar17 = pNVar17 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar55;
                      paVar18 = paVar18 + 1;
                    }
                  }
                  pRVar14 = pRVar15;
                } while ((uVar2 != 8) &&
                        (pRVar14 = (RayQueryContext *)((long)&pRVar15->scene + 1),
                        bVar20 = pRVar15 < (RayQueryContext *)0x3, pRVar15 = pRVar14,
                        uVar10 = uVar16, aVar55 = aVar49, bVar20));
                iVar21 = 0;
                if (uVar16 == 8) {
LAB_0025164a:
                  bVar20 = false;
                  iVar21 = 4;
                }
                else {
                  auVar40._4_4_ = -(uint)(aVar49.v[1] < tray.tfar.field_0.v[1]);
                  auVar40._0_4_ = -(uint)(aVar49.v[0] < tray.tfar.field_0.v[0]);
                  auVar40._8_4_ = -(uint)(aVar49.v[2] < tray.tfar.field_0.v[2]);
                  auVar40._12_4_ = -(uint)(aVar49.v[3] < tray.tfar.field_0.v[3]);
                  uVar11 = movmskps((int)uVar13,auVar40);
                  pRVar14 = (RayQueryContext *)(ulong)(uint)POPCOUNT(uVar11);
                  bVar20 = true;
                  if (pRVar14 <= pRVar19) {
                    pNVar17->ptr = uVar16;
                    pNVar17 = pNVar17 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar49;
                    paVar18 = paVar18 + 1;
                    goto LAB_0025164a;
                  }
                }
                root.ptr = uVar16;
              } while (bVar20);
            }
          }
        }
      } while (iVar21 != 3);
      auVar50._0_4_ = auVar45._0_4_ & terminated.field_0.i[0];
      auVar50._4_4_ = auVar45._4_4_ & terminated.field_0.i[1];
      auVar50._8_4_ = auVar45._8_4_ & terminated.field_0.i[2];
      auVar50._12_4_ = auVar45._12_4_ & terminated.field_0.i[3];
      auVar50 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar50);
      *(undefined1 (*) [16])(ray + 0x80) = auVar50;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }